

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

int on_frame_recv(nghttp2_session *session,nghttp2_frame *frame,void *userp)

{
  long lVar1;
  stream_ctx *psVar2;
  undefined8 *puVar3;
  RTSP *pRVar4;
  void *pvVar5;
  int iVar6;
  uint uVar7;
  int32_t iVar8;
  uint32_t uVar9;
  CURLUcode CVar10;
  int iVar11;
  CURLcode CVar12;
  CURLMcode CVar13;
  Curl_easy *data;
  size_t sVar14;
  CURL_conflict *data_00;
  FILEPROTO *pFVar15;
  CURLU *u;
  char *pcVar16;
  ulong uVar17;
  uint stream_id;
  Curl_easy *data_01;
  HTTP *pHVar18;
  Curl_easy *second;
  stream_ctx *newstream;
  char buffer [256];
  Curl_easy *local_150;
  stream_ctx *local_148;
  stream_ctx *local_140;
  curl_pushheaders local_138 [16];
  
  lVar1 = *(long *)((long)userp + 0x10);
  data_01 = *(Curl_easy **)(lVar1 + 0x10);
  stream_id = (frame->hd).stream_id;
  if (((data_01 != (Curl_easy *)0x0) && (((data_01->set).field_0x8bd & 0x10) != 0)) &&
     (0 < *(int *)(*userp + 0xc))) {
    iVar6 = fr_print(frame,(char *)local_138,(size_t)userp);
    *(undefined1 *)((long)&local_138[0].data + (long)iVar6) = 0;
    if ((((data_01->set).field_0x8bd & 0x10) != 0) && (0 < *(int *)(*userp + 0xc))) {
      Curl_trc_cf_infof(data_01,(Curl_cfilter *)userp,"[%d] <- %s",
                        (ulong)(uint)(frame->hd).stream_id,local_138);
    }
  }
  if (stream_id == 0) {
    if ((frame->hd).type == '\a') {
      *(byte *)(lVar1 + 200) = *(byte *)(lVar1 + 200) | 2;
      *(int32_t *)(lVar1 + 0xc0) = (frame->priority).pri_spec.weight;
      *(int32_t *)(lVar1 + 0xc4) = (frame->priority).pri_spec.stream_id;
      if (data_01 != (Curl_easy *)0x0) {
        if (((data_01->set).field_0x8bd & 0x10) != 0) {
          Curl_infof(data_01,"received GOAWAY, error=%d, last_stream=%u");
        }
        Curl_multi_connchanged(data_01->multi);
        return 0;
      }
      return 0;
    }
    if ((frame->hd).type != '\x04') {
      return 0;
    }
    if (((frame->hd).flags & 1) != 0) {
      return 0;
    }
    iVar6 = *(int *)(lVar1 + 8);
    uVar9 = nghttp2_session_get_remote_settings(session,NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS);
    *(uint32_t *)(lVar1 + 8) = uVar9;
    uVar9 = nghttp2_session_get_remote_settings(session,NGHTTP2_SETTINGS_ENABLE_PUSH);
    *(byte *)(lVar1 + 200) = *(byte *)(lVar1 + 200) & 0xfb | (uVar9 != 0) << 2;
    if (data_01 != (Curl_easy *)0x0) {
      if (((((data_01->set).field_0x8bd & 0x10) != 0) &&
          ((*(int *)(*userp + 0xc) < 1 ||
           (Curl_trc_cf_infof(data_01,(Curl_cfilter *)userp,"[0] MAX_CONCURRENT_STREAMS: %d",
                              (ulong)*(uint *)(lVar1 + 8)), ((data_01->set).field_0x8bd & 0x10) != 0
           )))) && (0 < *(int *)(*userp + 0xc))) {
        pcVar16 = "TRUE";
        if ((*(byte *)(lVar1 + 200) & 4) == 0) {
          pcVar16 = "false";
        }
        Curl_trc_cf_infof(data_01,(Curl_cfilter *)userp,"[0] ENABLE_PUSH: %s",pcVar16);
      }
      if (iVar6 != *(int *)(lVar1 + 8)) {
        if ((((data_01->set).field_0x8bd & 0x10) != 0) && (0 < *(int *)(*userp + 0xc))) {
          Curl_trc_cf_infof(data_01,(Curl_cfilter *)userp,"[0] notify MAX_CONCURRENT_STREAMS: %u");
        }
        Curl_multi_connchanged(data_01->multi);
      }
    }
    if (((data_01->req).keepon & 0x2aU) == 2) {
      pHVar18 = (data_01->req).p.http;
      if (pHVar18 == (HTTP *)0x0) {
        return 0;
      }
      psVar2 = (stream_ctx *)pHVar18->h2_ctx;
      if (psVar2 != (stream_ctx *)0x0) {
        drain_stream((Curl_cfilter *)userp,data_01,psVar2);
        return 0;
      }
      return 0;
    }
    return 0;
  }
  data = (Curl_easy *)nghttp2_session_get_stream_user_data(session,stream_id);
  if (data == (Curl_easy *)0x0) {
    if (data_01 == (Curl_easy *)0x0) {
      return 0;
    }
    if (((data_01->set).field_0x8bd & 0x10) == 0) {
      return 0;
    }
    if (*(int *)(*userp + 0xc) < 1) {
      return 0;
    }
    pcVar16 = "[%d] No Curl_easy associated";
    iVar6 = 0;
    goto LAB_006a21ef;
  }
  pHVar18 = (data->req).p.http;
  if (pHVar18 == (HTTP *)0x0) {
    stream_id = (frame->hd).stream_id;
  }
  else {
    psVar2 = (stream_ctx *)pHVar18->h2_ctx;
    stream_id = (frame->hd).stream_id;
    if (psVar2 != (stream_ctx *)0x0) {
      if (8 < (frame->hd).type) {
        return 0;
      }
      puVar3 = *(undefined8 **)((long)userp + 0x10);
      switch((frame->hd).type) {
      case '\0':
        sVar14 = Curl_bufq_len(&psVar2->recvbuf);
        if ((((data->set).field_0x8bd & 0x10) != 0) && (0 < *(int *)(*userp + 0xc))) {
          uVar7 = nghttp2_session_get_stream_effective_recv_data_length
                            ((nghttp2_session *)*puVar3,psVar2->id);
          iVar8 = nghttp2_session_get_stream_effective_local_window_size
                            ((nghttp2_session *)*puVar3,psVar2->id);
          Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"[%d] DATA, buffered=%zu, window=%d/%d",
                            (ulong)stream_id,sVar14,(ulong)uVar7,iVar8);
        }
        if (psVar2->bodystarted == false) {
          iVar6 = nghttp2_submit_rst_stream((nghttp2_session *)*puVar3,'\0',stream_id,1);
          iVar6 = nghttp2_is_fatal(iVar6);
          if (iVar6 != 0) {
            return -0x386;
          }
        }
        if (((frame->hd).flags & 1) == 0) {
          if (sVar14 <= psVar2->local_window_size) {
            return 0;
          }
          uVar9 = nghttp2_session_get_stream_local_window_size
                            ((nghttp2_session *)*puVar3,psVar2->id);
          if ((int)uVar9 < 1) {
            return 0;
          }
          if (uVar9 != psVar2->local_window_size) {
            nghttp2_session_set_local_window_size
                      ((nghttp2_session *)*puVar3,'\0',psVar2->id,psVar2->local_window_size);
            return 0;
          }
          return 0;
        }
        break;
      case '\x01':
        if (psVar2->bodystarted != false) {
          return 0;
        }
        if (psVar2->status_code == -1) {
          return -0x386;
        }
        if (99 < psVar2->status_code - 100U) {
          psVar2->bodystarted = true;
          psVar2->status_code = -1;
          pHVar18 = (HTTP *)(data->req).p.file;
        }
        CVar12 = recvbuf_write_hds((Curl_cfilter *)pHVar18,(Curl_easy *)0x8dc3ad,(char *)0x2,
                                   0x8f1fa4);
        if (CVar12 != CURLE_OK) {
          return -0x386;
        }
        if (99 < psVar2->status_code - 100U) {
          psVar2->resp_hds_complete = true;
        }
        break;
      default:
        goto switchD_006a1ece_caseD_2;
      case '\x03':
        psVar2->closed = true;
        if ((frame->priority).pri_spec.stream_id != 0) {
          psVar2->reset = true;
        }
        psVar2->send_closed = true;
        break;
      case '\x05':
        if ((((data->set).field_0x8bd & 0x10) != 0) && (0 < *(int *)(*userp + 0xc))) {
          Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"[%d] PUSH_PROMISE received");
        }
        if (data->multi->push_cb == (curl_push_callback)0x0) {
          if ((((data->set).field_0x8bd & 0x10) != 0) && (0 < *(int *)(*userp + 0xc))) {
            Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"Got PUSH_PROMISE, ignore it");
          }
          goto LAB_006a2511;
        }
        data_00 = curl_easy_duphandle(data);
        local_150 = data_00;
        if (data_00 == (CURL_conflict *)0x0) {
LAB_006a24d3:
          if (((data->set).field_0x8bd & 0x10) != 0) {
            Curl_infof(data,"failed to duplicate handle");
          }
        }
        else {
          pFVar15 = (FILEPROTO *)(*Curl_ccalloc)(1,0x70);
          if (pFVar15 == (FILEPROTO *)0x0) {
            Curl_close(&local_150);
            data_00 = local_150;
            if (local_150 == (CURL_conflict *)0x0) goto LAB_006a24d3;
          }
          else {
            (data_00->req).p.file = pFVar15;
            http2_data_setup(*(Curl_cfilter **)((long)userp + 0x10),data_00,&local_140);
            (data_00->state).priority.weight = (data->state).priority.weight;
          }
          local_138[0].data = data;
          local_138[0].frame = (nghttp2_push_promise *)frame;
          if ((((data->set).field_0x8bd & 0x10) != 0) && (0 < *(int *)(*userp + 0xc))) {
            Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"Got PUSH_PROMISE, ask application");
          }
          pRVar4 = (data->req).p.rtsp;
          if ((pRVar4 == (RTSP *)0x0) ||
             (pvVar5 = (pRVar4->http_wrapper).h2_ctx, pvVar5 == (void *)0x0)) {
            Curl_failf(data,"Internal NULL stream");
          }
          else {
            local_150 = (CURL_conflict *)0x0;
            u = curl_url();
            if (u != (CURLU *)0x0) {
              pcVar16 = curl_pushheader_byname(local_138,":scheme");
              if ((((pcVar16 == (char *)0x0) ||
                   (CVar10 = curl_url_set(u,CURLUPART_SCHEME,pcVar16,0), CVar10 == CURLUE_OK)) &&
                  ((pcVar16 = curl_pushheader_byname(local_138,":authority"), pcVar16 == (char *)0x0
                   || (CVar10 = Curl_url_set_authority(u,pcVar16,0x20), CVar10 == CURLUE_OK)))) &&
                 ((pcVar16 = curl_pushheader_byname(local_138,":path"), pcVar16 == (char *)0x0 ||
                  (CVar10 = curl_url_set(u,CURLUPART_PATH,pcVar16,0), CVar10 == CURLUE_OK)))) {
                CVar10 = curl_url_get(u,CURLUPART_URL,(char **)&local_150,0);
                curl_url_cleanup(u);
                if (CVar10 == CURLUE_OK) {
                  uVar7 = *(uint *)&(data_00->state).field_0x74c;
                  if ((uVar7 >> 0x10 & 1) != 0) {
                    (*Curl_cfree)((data_00->state).url);
                    uVar7 = *(uint *)&(data_00->state).field_0x74c;
                  }
                  *(uint *)&(data_00->state).field_0x74c = uVar7 | 0x10000;
                  (data_00->state).url = (char *)local_150;
                  CVar12 = http2_data_setup(*(Curl_cfilter **)((long)userp + 0x10),data_00,
                                            &local_148);
                  if (CVar12 == CURLE_OK) {
                    Curl_set_in_callback(data,true);
                    iVar6 = (*data->multi->push_cb)
                                      (data,data_00,*(size_t *)((long)pvVar5 + 0x130),local_138,
                                       data->multi->push_userp);
                    Curl_set_in_callback(data,false);
                    if (*(long *)((long)pvVar5 + 0x130) != 0) {
                      uVar17 = 0;
                      do {
                        (*Curl_cfree)(*(void **)(*(long *)((long)pvVar5 + 0x128) + uVar17 * 8));
                        uVar17 = uVar17 + 1;
                      } while (uVar17 < *(ulong *)((long)pvVar5 + 0x130));
                    }
                    (*Curl_cfree)(*(void **)((long)pvVar5 + 0x128));
                    *(undefined1 (*) [16])((long)pvVar5 + 0x128) = (undefined1  [16])0x0;
                    if (iVar6 == 0) {
                      local_148->id = (frame->push_promise).promised_stream_id;
                      *(undefined4 *)&(data_00->req).size = 0xffffffff;
                      *(undefined4 *)((long)&(data_00->req).size + 4) = 0xffffffff;
                      *(undefined4 *)&(data_00->req).maxdownload = 0xffffffff;
                      *(undefined4 *)((long)&(data_00->req).maxdownload + 4) = 0xffffffff;
                      CVar13 = Curl_multi_add_perform
                                         (data->multi,data_00,*(connectdata **)((long)userp + 0x18))
                      ;
                      if (CVar13 == CURLM_OK) {
                        iVar6 = nghttp2_session_set_stream_user_data
                                          ((nghttp2_session *)*puVar3,local_148->id,data_00);
                        if (iVar6 == 0) {
                          return 0;
                        }
                        if (((data->set).field_0x8bd & 0x10) != 0) {
                          Curl_infof(data,"failed to set user_data for stream %u",
                                     (ulong)(uint)local_148->id);
                        }
                        goto LAB_006a2511;
                      }
                      if (((data->set).field_0x8bd & 0x10) != 0) {
                        Curl_infof(data,"failed to add handle to multi");
                      }
                    }
                  }
                  else {
                    Curl_failf(data,"error setting up stream: %d",(ulong)CVar12);
                  }
                }
              }
              else {
                curl_url_cleanup(u);
              }
            }
          }
          discard_newhandle((Curl_cfilter *)userp,data_00);
        }
LAB_006a2511:
        iVar6 = nghttp2_submit_rst_stream
                          ((nghttp2_session *)*puVar3,'\0',(frame->push_promise).promised_stream_id,
                           8);
        iVar11 = nghttp2_is_fatal(iVar6);
        if (iVar11 == 0) {
          if (iVar6 != 2) {
            return 0;
          }
          if ((((data->set).field_0x8bd & 0x10) != 0) && (0 < *(int *)(*userp + 0xc))) {
            Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"[%d] fail in PUSH_PROMISE received",
                              (ulong)stream_id);
          }
        }
        return -0x386;
      case '\b':
        if (((data->req).keepon & 0x2aU) != 2) {
          return 0;
        }
      }
      drain_stream((Curl_cfilter *)userp,data,psVar2);
switchD_006a1ece_caseD_2:
      return 0;
    }
  }
  iVar6 = -0x386;
  if (((data->set).field_0x8bd & 0x10) == 0) {
    return -0x386;
  }
  if (*(int *)(*userp + 0xc) < 1) {
    return -0x386;
  }
  pcVar16 = "[%d] No stream_ctx set";
  data_01 = data;
LAB_006a21ef:
  Curl_trc_cf_infof(data_01,(Curl_cfilter *)userp,pcVar16,(ulong)stream_id);
  return iVar6;
}

Assistant:

static int on_frame_recv(nghttp2_session *session, const nghttp2_frame *frame,
                         void *userp)
{
  struct Curl_cfilter *cf = userp;
  struct cf_h2_ctx *ctx = cf->ctx;
  struct Curl_easy *data = CF_DATA_CURRENT(cf), *data_s;
  int32_t stream_id = frame->hd.stream_id;

  DEBUGASSERT(data);
#ifndef CURL_DISABLE_VERBOSE_STRINGS
  if(Curl_trc_cf_is_verbose(cf, data)) {
    char buffer[256];
    int len;
    len = fr_print(frame, buffer, sizeof(buffer)-1);
    buffer[len] = 0;
    CURL_TRC_CF(data, cf, "[%d] <- %s",frame->hd.stream_id, buffer);
  }
#endif /* !CURL_DISABLE_VERBOSE_STRINGS */

  if(!stream_id) {
    /* stream ID zero is for connection-oriented stuff */
    DEBUGASSERT(data);
    switch(frame->hd.type) {
    case NGHTTP2_SETTINGS: {
      if(!(frame->hd.flags & NGHTTP2_FLAG_ACK)) {
        uint32_t max_conn = ctx->max_concurrent_streams;
        ctx->max_concurrent_streams = nghttp2_session_get_remote_settings(
            session, NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS);
        ctx->enable_push = nghttp2_session_get_remote_settings(
            session, NGHTTP2_SETTINGS_ENABLE_PUSH) != 0;
        CURL_TRC_CF(data, cf, "[0] MAX_CONCURRENT_STREAMS: %d",
                    ctx->max_concurrent_streams);
        CURL_TRC_CF(data, cf, "[0] ENABLE_PUSH: %s",
                    ctx->enable_push ? "TRUE" : "false");
        if(data && max_conn != ctx->max_concurrent_streams) {
          /* only signal change if the value actually changed */
          CURL_TRC_CF(data, cf, "[0] notify MAX_CONCURRENT_STREAMS: %u",
                      ctx->max_concurrent_streams);
          Curl_multi_connchanged(data->multi);
        }
        /* Since the initial stream window is 64K, a request might be on HOLD,
         * due to exhaustion. The (initial) SETTINGS may announce a much larger
         * window and *assume* that we treat this like a WINDOW_UPDATE. Some
         * servers send an explicit WINDOW_UPDATE, but not all seem to do that.
         * To be safe, we UNHOLD a stream in order not to stall. */
        if(CURL_WANT_SEND(data)) {
          struct stream_ctx *stream = H2_STREAM_CTX(data);
          if(stream)
            drain_stream(cf, data, stream);
        }
      }
      break;
    }
    case NGHTTP2_GOAWAY:
      ctx->goaway = TRUE;
      ctx->goaway_error = frame->goaway.error_code;
      ctx->last_stream_id = frame->goaway.last_stream_id;
      if(data) {
        infof(data, "received GOAWAY, error=%d, last_stream=%u",
                    ctx->goaway_error, ctx->last_stream_id);
        Curl_multi_connchanged(data->multi);
      }
      break;
    default:
      break;
    }
    return 0;
  }

  data_s = nghttp2_session_get_stream_user_data(session, stream_id);
  if(!data_s) {
    CURL_TRC_CF(data, cf, "[%d] No Curl_easy associated", stream_id);
    return 0;
  }

  return on_stream_frame(cf, data_s, frame)? NGHTTP2_ERR_CALLBACK_FAILURE : 0;
}